

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gop_structure.c
# Opt level: O2

void set_src_offset(GF_GROUP *gf_group,int *first_frame_index,int cur_frame_idx,int frame_ind)

{
  int iVar1;
  
  if (0 < gf_group->frame_parallel_level[frame_ind]) {
    if (gf_group->frame_parallel_level[frame_ind] == 1) {
      *first_frame_index = cur_frame_idx;
      iVar1 = cur_frame_idx;
    }
    else {
      iVar1 = *first_frame_index;
    }
    gf_group->src_offset[frame_ind] =
         ((uint)gf_group->arf_src_offset[frame_ind] + cur_frame_idx) - iVar1;
  }
  return;
}

Assistant:

static void set_src_offset(GF_GROUP *const gf_group, int *first_frame_index,
                           int cur_frame_idx, int frame_ind) {
  if (gf_group->frame_parallel_level[frame_ind] > 0) {
    if (gf_group->frame_parallel_level[frame_ind] == 1) {
      *first_frame_index = cur_frame_idx;
    }

    // Obtain the offset of the frame at frame_ind in the lookahead queue by
    // subtracting the display order hints of the current frame from the display
    // order hint of the first frame in parallel encoding set (at
    // first_frame_index).
    gf_group->src_offset[frame_ind] =
        (cur_frame_idx + gf_group->arf_src_offset[frame_ind]) -
        *first_frame_index;
  }
}